

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode add_next_timeout(timeval now,Curl_multi *multi,Curl_easy *d)

{
  curl_llist *list;
  curl_llist_element *pcVar1;
  __suseconds_t _Var2;
  time_t tVar3;
  Curl_tree *pCVar4;
  curl_llist_element *pcVar5;
  void *pvVar6;
  
  list = &(d->state).timeoutlist;
  pcVar5 = (d->state).timeoutlist.head;
  if (pcVar5 == (curl_llist_element *)0x0) {
    pvVar6 = (void *)0x0;
  }
  else {
    do {
      pvVar6 = pcVar5->ptr;
      pcVar1 = pcVar5->next;
      tVar3 = curlx_tvdiff(*(timeval *)((long)pvVar6 + 0x18),now);
      if (0 < tVar3) break;
      Curl_llist_remove(list,pcVar5,(void *)0x0);
      pcVar5 = pcVar1;
    } while (pcVar1 != (curl_llist_element *)0x0);
  }
  pCVar4 = (Curl_tree *)&(d->state).expiretime;
  pcVar5 = list->head;
  if (pcVar5 == (curl_llist_element *)0x0) {
    ((timeval *)pCVar4)->tv_sec = 0;
    (d->state).expiretime.tv_usec = 0;
  }
  else {
    _Var2 = *(__suseconds_t *)((long)pvVar6 + 0x20);
    ((timeval *)pCVar4)->tv_sec = *(__time_t *)((long)pvVar6 + 0x18);
    (d->state).expiretime.tv_usec = _Var2;
    Curl_llist_remove(list,pcVar5,(void *)0x0);
    pCVar4 = Curl_splayinsert((d->state).expiretime,multi->timetree,&(d->state).timenode);
    multi->timetree = pCVar4;
  }
  return (CURLMcode)pCVar4;
}

Assistant:

static CURLMcode add_next_timeout(struct timeval now,
                                  struct Curl_multi *multi,
                                  struct Curl_easy *d)
{
  struct timeval *tv = &d->state.expiretime;
  struct curl_llist *list = &d->state.timeoutlist;
  struct curl_llist_element *e;
  struct time_node *node = NULL;

  /* move over the timeout list for this specific handle and remove all
     timeouts that are now passed tense and store the next pending
     timeout in *tv */
  for(e = list->head; e;) {
    struct curl_llist_element *n = e->next;
    time_t diff;
    node = (struct time_node *)e->ptr;
    diff = curlx_tvdiff(node->time, now);
    if(diff <= 0)
      /* remove outdated entry */
      Curl_llist_remove(list, e, NULL);
    else
      /* the list is sorted so get out on the first mismatch */
      break;
    e = n;
  }
  e = list->head;
  if(!e) {
    /* clear the expire times within the handles that we remove from the
       splay tree */
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }
  else {
    /* copy the first entry to 'tv' */
    memcpy(tv, &node->time, sizeof(*tv));

    /* remove first entry from list */
    Curl_llist_remove(list, e, NULL);

    /* insert this node again into the splay */
    multi->timetree = Curl_splayinsert(*tv, multi->timetree,
                                       &d->state.timenode);
  }
  return CURLM_OK;
}